

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURL * curl_easy_init(void)

{
  CURLcode CVar1;
  SessionHandle *in_RAX;
  SessionHandle *data;
  
  data = in_RAX;
  if (initialized == 0) {
    curl_global_init(3);
  }
  CVar1 = Curl_open(&data);
  if (CVar1 != CURLE_OK) {
    data = (SessionHandle *)0x0;
  }
  return data;
}

Assistant:

CURL *curl_easy_init(void)
{
  CURLcode res;
  struct SessionHandle *data;

  /* Make sure we inited the global SSL stuff */
  if(!initialized) {
    res = curl_global_init(CURL_GLOBAL_DEFAULT);
    if(res) {
      /* something in the global init failed, return nothing */
      DEBUGF(fprintf(stderr, "Error: curl_global_init failed\n"));
      return NULL;
    }
  }

  /* We use curl_open() with undefined URL so far */
  res = Curl_open(&data);
  if(res != CURLE_OK) {
    DEBUGF(fprintf(stderr, "Error: Curl_open failed\n"));
    return NULL;
  }

  return data;
}